

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

char * addpackagedir(char *dir)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  packagedir *ppVar5;
  char *pcVar6;
  string pdir;
  char acStack_128 [272];
  size_t sVar7;
  
  pcVar4 = acStack_128;
  copystring(acStack_128,dir,0x104);
  bVar1 = subhomedir(acStack_128,0x104,dir);
  if ((bVar1) && (sVar3 = fixpackagedir(acStack_128), sVar3 != 0)) {
    while ((pcVar4 = strstr(pcVar4,"packages"), pcVar4 != (char *)0x0 &&
           (((pcVar4 <= acStack_128 || (pcVar4[-1] != '/')) || (pcVar4[8] != '/'))))) {
      pcVar4 = pcVar4 + 8;
    }
    ppVar5 = vector<packagedir>::add(&packagedirs);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = newstring(acStack_128);
      ppVar5->dir = pcVar4;
      sVar7 = strlen(acStack_128);
      ppVar5->dirlen = (int)sVar7;
      ppVar5->filter = (char *)0x0;
      iVar2 = 0;
    }
    else {
      pcVar6 = newstring(acStack_128,(long)pcVar4 - (long)acStack_128);
      ppVar5->dir = pcVar6;
      ppVar5->dirlen = (int)((long)pcVar4 - (long)acStack_128);
      pcVar6 = newstring(pcVar4);
      ppVar5->filter = pcVar6;
      sVar7 = strlen(pcVar4);
      iVar2 = (int)sVar7;
      pcVar4 = ppVar5->dir;
    }
    ppVar5->filterlen = iVar2;
  }
  else {
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

const char *addpackagedir(const char *dir)
{
    string pdir;
    copystring(pdir, dir);
    if(!subhomedir(pdir, sizeof(pdir), dir) || !fixpackagedir(pdir)) return NULL;
    char *filter = pdir;
    for(;;)
    {
        static int len = strlen("packages");
        filter = strstr(filter, "packages");
        if(!filter) break;
        if(filter > pdir && filter[-1] == PATHDIV && filter[len] == PATHDIV) break;
        filter += len;
    }
    packagedir &pf = packagedirs.add();
    pf.dir = filter ? newstring(pdir, filter-pdir) : newstring(pdir);
    pf.dirlen = filter ? filter-pdir : strlen(pdir);
    pf.filter = filter ? newstring(filter) : NULL;
    pf.filterlen = filter ? strlen(filter) : 0;
    return pf.dir;
}